

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_order_t * bov_order_new(GLuint *elements,GLsizei n,GLenum usage)

{
  bov_order_t *pbVar1;
  GLsizei local_24;
  bov_order_t *order;
  GLenum usage_local;
  GLsizei n_local;
  GLuint *elements_local;
  
  pbVar1 = (bov_order_t *)malloc(0xc);
  if (pbVar1 != (bov_order_t *)0x0) {
    local_24 = n;
    if (elements == (GLuint *)0x0) {
      local_24 = 0;
    }
    pbVar1->eboLen = local_24;
    (*glad_glGenBuffers)(1,(GLuint *)pbVar1);
    (*glad_glBindBuffer)(0x8893,pbVar1->ebo);
    (*glad_glBufferData)(0x8893,(long)n << 2,elements,usage);
    pbVar1->eboCapacity = n;
    return pbVar1;
  }
  bov_error_log(0x30001,"Memory allocation failed");
  fprintf(_stderr,"\t(in function %s, line %d)\n","bov_order_new",0x3b6);
  exit(1);
}

Assistant:

bov_order_t* bov_order_new(const GLuint* elements, GLsizei n, GLenum usage)
{
	bov_order_t* order = malloc(sizeof(bov_order_t));
	CHECK_MALLOC(order);

	order->eboLen = elements==NULL ? 0 : n;

	glGenBuffers(1, &order->ebo);
	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(GLuint), elements, usage);
	order->eboCapacity = n;
	return order;
}